

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDdPMR::processVoiceFrame(DSDdPMR *this,int symbolIndex,int dibit)

{
  uchar *puVar1;
  DSDDecoder *pDVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  double in_XMM0_Qa;
  double __x;
  
  if (symbolIndex == 0) {
    if ((this->m_dsdDecoder->m_opts).errorbars == 1) {
      DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
    }
  }
  else {
    iVar5 = symbolIndex % 0x24;
    if (iVar5 != 0) goto LAB_0011ba50;
  }
  this->w = &rW;
  this->x = &rX;
  this->y = &rY;
  this->z = &rZ;
  pDVar2 = this->m_dsdDecoder;
  pDVar2->m_mbeDVFrame1[8] = '\0';
  pDVar2->m_mbeDVFrame1[0] = '\0';
  pDVar2->m_mbeDVFrame1[1] = '\0';
  pDVar2->m_mbeDVFrame1[2] = '\0';
  pDVar2->m_mbeDVFrame1[3] = '\0';
  pDVar2->m_mbeDVFrame1[4] = '\0';
  pDVar2->m_mbeDVFrame1[5] = '\0';
  pDVar2->m_mbeDVFrame1[6] = '\0';
  pDVar2->m_mbeDVFrame1[7] = '\0';
  iVar5 = 0;
LAB_0011ba50:
  this->m_dsdDecoder->ambe_fr[*this->w][*this->x] = (byte)dibit >> 1 & 1;
  this->m_dsdDecoder->ambe_fr[*this->y][*this->z] = (byte)dibit & 1;
  this->w = this->w + 1;
  this->x = this->x + 1;
  this->y = this->y + 1;
  this->z = this->z + 1;
  if (this->m_dsdDecoder->m_mbelibEnable == false) {
    cVar3 = (char)iVar5;
    bVar4 = ((byte)(cVar3 >> 7) >> 6) + cVar3;
    puVar1 = this->m_dsdDecoder->m_mbeDVFrame1 + ((char)bVar4 >> 2);
    *puVar1 = *puVar1 | (byte)(dibit << ((cVar3 - (bVar4 & 0x7c)) * -2 + 6 & 0x1f));
  }
  if (iVar5 == 0x23) {
    DSDMBEDecoder::processFrame
              (&this->m_dsdDecoder->m_mbeDecoder1,(char (*) [23])0x0,this->m_dsdDecoder->ambe_fr,
               (char (*) [24])0x0);
    pDVar2 = this->m_dsdDecoder;
    pDVar2->m_mbeDVReady1 = true;
    if ((pDVar2->m_opts).errorbars == 1) {
      DSDLogger::log(&pDVar2->m_dsdLogger,__x);
      return;
    }
  }
  return;
}

Assistant:

void DSDdPMR::processVoiceFrame(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    if (symbolIndex % 36 == 0)
    {
        w = rW;
        x = rX;
        y = rY;
        z = rZ;
        memset((void *) m_dsdDecoder->m_mbeDVFrame1, 0, 9); // initialize DVSI frame
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & (dibit >> 1)); // bit 1
    m_dsdDecoder->ambe_fr[*y][*z] = (1 & dibit);        // bit 0
    w++;
    x++;
    y++;
    z++;

    storeSymbolDV(symbolIndex % 36, dibit); // store dibit for DVSI hardware decoder

    if (symbolIndex % 36 == 35)
    {
        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}